

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void * duckdb_je_arena_palloc
                 (tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool zero,_Bool slab,
                 tcache_t *tcache)

{
  void **ppvVar1;
  cache_bin_stats_t *pcVar2;
  uint16_t uVar3;
  void **ppvVar4;
  szind_t sVar5;
  ulong uVar6;
  arena_t *arena_00;
  void *pvVar7;
  ulong uVar8;
  undefined7 in_register_00000089;
  cache_bin_t *cache_bin;
  _Bool local_3d;
  szind_t local_3c;
  ulong local_38;
  
  if ((int)CONCAT71(in_register_00000089,slab) == 0) {
    if (alignment < 0x41) {
      pvVar7 = duckdb_je_large_malloc(tsdn,arena,usize,zero);
      return pvVar7;
    }
    pvVar7 = duckdb_je_large_palloc(tsdn,arena,usize,alignment,zero);
    return pvVar7;
  }
  if (usize < 0x1001) {
    uVar6 = (ulong)duckdb_je_sz_size2index_tab[usize + 7 >> 3];
  }
  else {
    sVar5 = sz_size2index_compute(usize);
    uVar6 = (ulong)sVar5;
  }
  if (tcache == (tcache_t *)0x0) {
    pvVar7 = duckdb_je_arena_malloc_hard(tsdn,arena,usize,(szind_t)uVar6,zero,true);
    return pvVar7;
  }
  cache_bin = tcache->bins + uVar6;
  ppvVar4 = cache_bin->stack_head;
  pvVar7 = *ppvVar4;
  ppvVar1 = ppvVar4 + 1;
  uVar3 = tcache->bins[uVar6].low_bits_low_water;
  uVar8 = uVar6;
  if (uVar3 == (uint16_t)ppvVar4) {
    if (tcache->bins[uVar6].low_bits_empty == uVar3) {
      local_3c = (szind_t)uVar6;
      local_38 = uVar6;
      arena_00 = arena_choose(&tsdn->tsd,arena);
      sVar5 = local_3c;
      if (arena_00 != (arena_t *)0x0) {
        if (cache_bin->stack_head == (void **)&duckdb_je_disabled_bin) {
          pvVar7 = duckdb_je_arena_malloc_hard(tsdn,arena_00,usize,local_3c,zero,true);
          return pvVar7;
        }
        duckdb_je_tcache_bin_flush_stashed(&tsdn->tsd,tcache,cache_bin,local_3c,true);
        pvVar7 = duckdb_je_tcache_alloc_small_hard(tsdn,arena_00,tcache,cache_bin,sVar5,&local_3d);
        uVar8 = local_38;
        if (local_3d != false) goto LAB_00e50b9d;
      }
      return (void *)0x0;
    }
    cache_bin->stack_head = ppvVar1;
    tcache->bins[uVar6].low_bits_low_water = (uint16_t)ppvVar1;
  }
  else {
    cache_bin->stack_head = ppvVar1;
  }
LAB_00e50b9d:
  if (zero) {
    switchD_0049f7f1::default(pvVar7,0,duckdb_je_sz_index2size_tab[uVar8]);
  }
  pcVar2 = &tcache->bins[uVar6].tstats;
  pcVar2->nrequests = pcVar2->nrequests + 1;
  return pvVar7;
}

Assistant:

void *
arena_palloc(tsdn_t *tsdn, arena_t *arena, size_t usize, size_t alignment,
    bool zero, bool slab, tcache_t *tcache) {
	if (slab) {
		assert(sz_can_use_slab(usize));
		/* Small; alignment doesn't require special slab placement. */

		/* usize should be a result of sz_sa2u() */
		assert((usize & (alignment - 1)) == 0);

		/*
		 * Small usize can't come from an alignment larger than a page.
		 */
		assert(alignment <= PAGE);

		return arena_malloc(tsdn, arena, usize, sz_size2index(usize),
		    zero, slab, tcache, true);
	} else {
		if (likely(alignment <= CACHELINE)) {
			return large_malloc(tsdn, arena, usize, zero);
		} else {
			return large_palloc(tsdn, arena, usize, alignment, zero);
		}
	}
}